

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Slider.cxx
# Opt level: O3

void __thiscall Fl_Slider::draw(Fl_Slider *this,int X,int Y,int W,int H)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  Fl_Color FVar6;
  _func_int **pp_Var7;
  byte bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  Fl_Boxtype t;
  uint uVar13;
  int W_00;
  int H_00;
  int H_01;
  int iVar14;
  double dVar15;
  double dVar16;
  int local_68;
  
  dVar1 = (this->super_Fl_Valuator).min;
  dVar2 = (this->super_Fl_Valuator).max;
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    dVar16 = ((this->super_Fl_Valuator).value_ - dVar1) / (dVar2 - dVar1);
    dVar15 = 1.0;
    if ((dVar16 <= 1.0) && (dVar15 = dVar16, dVar16 < 0.0)) {
      dVar15 = 0.0;
    }
  }
  else {
    dVar15 = 0.5;
  }
  bVar8 = (this->super_Fl_Valuator).super_Fl_Widget.type_;
  iVar14 = W;
  if ((bVar8 & 1) == 0) {
    iVar14 = H;
  }
  if ((bVar8 & 0xfe) == 2) {
    H_01 = (int)(dVar15 * (double)iVar14 + 0.5);
    if (dVar1 <= dVar2) {
      local_68 = 0;
    }
    else {
      local_68 = H_01;
      H_01 = iVar14 - H_01;
    }
  }
  else {
    H_01 = (int)((float)iVar14 * *(float *)&(this->super_Fl_Valuator).field_0xa4 + 0.5);
    iVar9 = H;
    if ((bVar8 & 1) == 0) {
      iVar9 = W;
    }
    iVar9 = iVar9 / 2 + (uint)((bVar8 & 0xfe) == 4) * 4 + 1;
    if (H_01 < iVar9) {
      H_01 = iVar9;
    }
    local_68 = (int)(dVar15 * (double)(iVar14 - H_01) + 0.5);
  }
  if ((bVar8 & 1) == 0) {
    local_68 = local_68 + Y;
    iVar14 = X;
    iVar9 = W;
  }
  else {
    iVar14 = local_68 + X;
    iVar9 = H_01;
    H_01 = H;
    local_68 = Y;
  }
  draw_bg(this,X,Y,W,H);
  bVar3 = (this->super_Fl_Valuator).super_Fl_Widget.box_ & 0xfe;
  bVar8 = 2;
  if (bVar3 != 0) {
    bVar8 = bVar3;
  }
  bVar3 = (byte)*(undefined4 *)&this->slider_;
  if (bVar3 != 0) {
    bVar8 = bVar3;
  }
  bVar3 = (this->super_Fl_Valuator).super_Fl_Widget.type_;
  t = (Fl_Boxtype)bVar8;
  if (bVar3 == 5) {
    Fl_Widget::draw_box((Fl_Widget *)this,t,iVar14,local_68,iVar9,H_01,0x31);
    uVar4 = (iVar9 - (iVar9 + -4 >> 0x1f)) - 4;
    iVar11 = ((int)uVar4 >> 1) + iVar14;
    iVar10 = local_68 + 2;
    W_00 = iVar9 - (uVar4 & 0xfffffffe);
    H_00 = H_01 + -4;
  }
  else {
    if (bVar3 != 4) {
      if (0 < H_01 && 0 < iVar9) {
        Fl_Widget::draw_box((Fl_Widget *)this,t,iVar14,local_68,iVar9,H_01,
                            (this->super_Fl_Valuator).super_Fl_Widget.color2_);
        bVar3 = (this->super_Fl_Valuator).super_Fl_Widget.type_;
      }
      if ((((bVar3 & 0xfe) != 2) && (Fl::scheme_ != (char *)0x0)) &&
         (iVar10 = strcmp("gtk+",Fl::scheme_), iVar10 == 0)) {
        if ((H < W) && (H_01 + 8 < iVar9)) {
          iVar10 = ((iVar9 - H_01) - ((iVar9 - H_01) + -4 >> 0x1f)) + -4 >> 1;
          iVar11 = iVar10 + iVar14;
          uVar5 = local_68 + 3;
          FVar6 = fl_color_average((this->super_Fl_Valuator).super_Fl_Widget.color2_,0x38,0.67);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                    (fl_graphics_driver,(ulong)FVar6);
          uVar12 = (H_01 + local_68) - 5;
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])();
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                    (fl_graphics_driver,(ulong)(iVar10 + iVar14 + 6),uVar12,
                     (ulong)(uint)(H_01 + -2 + iVar11),(ulong)uVar5);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                    (fl_graphics_driver,(ulong)(iVar14 + iVar10 + 0xc),uVar12,
                     (ulong)(uint)(H_01 + 4 + iVar11),(ulong)uVar5);
          FVar6 = fl_color_average((this->super_Fl_Valuator).super_Fl_Widget.color2_,0xff,0.67);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                    (fl_graphics_driver,(ulong)FVar6);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                    (fl_graphics_driver,(ulong)(iVar14 + iVar10 + 1),uVar12,
                     (ulong)((H_01 + iVar11) - 7),(ulong)uVar5);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                    (fl_graphics_driver,(ulong)(iVar10 + iVar14 + 7),uVar12,
                     (ulong)(uint)(H_01 + -1 + iVar11),(ulong)uVar5);
          uVar13 = iVar10 + iVar14 + 0xd;
          uVar4 = H_01 + 5 + iVar11;
          pp_Var7 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
        }
        else {
          if ((H <= W) || (H_01 <= iVar9 + 8)) goto LAB_001ba688;
          uVar13 = iVar14 + 4;
          iVar10 = ((H_01 - iVar9) - ((H_01 - iVar9) + -4 >> 0x1f)) + -4 >> 1;
          iVar11 = iVar10 + local_68;
          FVar6 = fl_color_average((this->super_Fl_Valuator).super_Fl_Widget.color2_,0x38,0.67);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                    (fl_graphics_driver,(ulong)FVar6);
          uVar4 = iVar9 + -4 + iVar14;
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                    (fl_graphics_driver,(ulong)uVar13,(ulong)((iVar11 + iVar9) - 8));
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                    (fl_graphics_driver,(ulong)uVar13,(ulong)(uint)(iVar9 + -2 + iVar11),uVar4,
                     (ulong)(local_68 + iVar10 + 6));
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                    (fl_graphics_driver,(ulong)uVar13,(ulong)(iVar11 + iVar9 + 4),uVar4,
                     (ulong)(uint)(iVar10 + 0xc + local_68));
          FVar6 = fl_color_average((this->super_Fl_Valuator).super_Fl_Widget.color2_,0xff,0.67);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                    (fl_graphics_driver,(ulong)FVar6);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                    (fl_graphics_driver,(ulong)uVar13,(ulong)((iVar11 + iVar9) - 7),(ulong)uVar4,
                     (ulong)(iVar10 + local_68 + 1));
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                    (fl_graphics_driver,uVar13,(ulong)((iVar11 + iVar9) - 1),(ulong)uVar4,
                     (ulong)(uint)(iVar10 + 7 + local_68));
          uVar12 = iVar11 + iVar9 + 5;
          uVar5 = iVar10 + 0xd + local_68;
          pp_Var7 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
        }
        (*pp_Var7[0xc])(fl_graphics_driver,(ulong)uVar13,(ulong)uVar12,(ulong)uVar4,(ulong)uVar5);
      }
      goto LAB_001ba688;
    }
    Fl_Widget::draw_box((Fl_Widget *)this,(uint)bVar8,iVar14,local_68,iVar9,H_01,0x31);
    uVar4 = (H_01 - (H_01 + -4 >> 0x1f)) - 4;
    iVar11 = iVar14 + 2;
    iVar10 = ((int)uVar4 >> 1) + local_68;
    W_00 = iVar9 + -4;
    H_00 = H_01 - (uVar4 & 0xfffffffe);
  }
  Fl_Widget::draw_box((Fl_Widget *)this,FL_THIN_DOWN_BOX,iVar11,iVar10,W_00,H_00,
                      (this->super_Fl_Valuator).super_Fl_Widget.color2_);
LAB_001ba688:
  Fl_Widget::draw_label((Fl_Widget *)this,iVar14,local_68,iVar9,H_01);
  if ((Fl_Slider *)Fl::focus_ == this) {
    if (((this->super_Fl_Valuator).super_Fl_Widget.type_ & 0xfe) == 2) {
      t = (Fl_Boxtype)(this->super_Fl_Valuator).super_Fl_Widget.box_;
      iVar14 = (this->super_Fl_Valuator).super_Fl_Widget.x_;
      local_68 = (this->super_Fl_Valuator).super_Fl_Widget.y_;
      iVar9 = (this->super_Fl_Valuator).super_Fl_Widget.w_;
      H_01 = (this->super_Fl_Valuator).super_Fl_Widget.h_;
    }
    Fl_Widget::draw_focus((Fl_Widget *)this,t,iVar14,local_68,iVar9,H_01);
    return;
  }
  return;
}

Assistant:

void Fl_Slider::draw(int X, int Y, int W, int H) {

  double val;
  if (minimum() == maximum())
    val = 0.5;
  else {
    val = (value()-minimum())/(maximum()-minimum());
    if (val > 1.0) val = 1.0;
    else if (val < 0.0) val = 0.0;
  }

  int ww = (horizontal() ? W : H);
  int xx, S;
  if (type()==FL_HOR_FILL_SLIDER || type() == FL_VERT_FILL_SLIDER) {
    S = int(val*ww+.5);
    if (minimum()>maximum()) {S = ww-S; xx = ww-S;}
    else xx = 0;
  } else {
    S = int(slider_size_*ww+.5);
    int T = (horizontal() ? H : W)/2+1;
    if (type()==FL_VERT_NICE_SLIDER || type()==FL_HOR_NICE_SLIDER) T += 4;
    if (S < T) S = T;
    xx = int(val*(ww-S)+.5);
  }
  int xsl, ysl, wsl, hsl;
  if (horizontal()) {
    xsl = X+xx;
    wsl = S;
    ysl = Y;
    hsl = H;
  } else {
    ysl = Y+xx;
    hsl = S;
    xsl = X;
    wsl = W;
  }

  draw_bg(X, Y, W, H);

  Fl_Boxtype box1 = slider();
  if (!box1) {box1 = (Fl_Boxtype)(box()&-2); if (!box1) box1 = FL_UP_BOX;}
  if (type() == FL_VERT_NICE_SLIDER) {
    draw_box(box1, xsl, ysl, wsl, hsl, FL_GRAY);
    int d = (hsl-4)/2;
    draw_box(FL_THIN_DOWN_BOX, xsl+2, ysl+d, wsl-4, hsl-2*d,selection_color());
  } else if (type() == FL_HOR_NICE_SLIDER) {
    draw_box(box1, xsl, ysl, wsl, hsl, FL_GRAY);
    int d = (wsl-4)/2;
    draw_box(FL_THIN_DOWN_BOX, xsl+d, ysl+2, wsl-2*d, hsl-4,selection_color());
  } else {
    if (wsl>0 && hsl>0) draw_box(box1, xsl, ysl, wsl, hsl, selection_color());

    if (type() != FL_HOR_FILL_SLIDER && type() != FL_VERT_FILL_SLIDER &&
        Fl::is_scheme("gtk+")) {
      if (W>H && wsl>(hsl+8)) {
        // Draw horizontal grippers
	int yy, hh;
	hh = hsl-8;
	xx = xsl+(wsl-hsl-4)/2;
	yy = ysl+3;

	fl_color(fl_darker(selection_color()));
	fl_line(xx, yy+hh, xx+hh, yy);
	fl_line(xx+6, yy+hh, xx+hh+6, yy);
	fl_line(xx+12, yy+hh, xx+hh+12, yy);

        xx++;
	fl_color(fl_lighter(selection_color()));
	fl_line(xx, yy+hh, xx+hh, yy);
	fl_line(xx+6, yy+hh, xx+hh+6, yy);
	fl_line(xx+12, yy+hh, xx+hh+12, yy);
      } else if (H>W && hsl>(wsl+8)) {
        // Draw vertical grippers
	int yy;
	xx = xsl+4;
	ww = wsl-8;
	yy = ysl+(hsl-wsl-4)/2;

	fl_color(fl_darker(selection_color()));
	fl_line(xx, yy+ww, xx+ww, yy);
	fl_line(xx, yy+ww+6, xx+ww, yy+6);
	fl_line(xx, yy+ww+12, xx+ww, yy+12);

        yy++;
	fl_color(fl_lighter(selection_color()));
	fl_line(xx, yy+ww, xx+ww, yy);
	fl_line(xx, yy+ww+6, xx+ww, yy+6);
	fl_line(xx, yy+ww+12, xx+ww, yy+12);
      }
    }
  }

  draw_label(xsl, ysl, wsl, hsl);
  if (Fl::focus() == this) {
    if (type() == FL_HOR_FILL_SLIDER || type() == FL_VERT_FILL_SLIDER) draw_focus();
    else draw_focus(box1, xsl, ysl, wsl, hsl);
  }
}